

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O2

QRegion __thiscall QRegion::united(QRegion *this,QRect *r)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  QRect *in_RDX;
  QRegionPrivate *pQVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  QRegionPrivate rp;
  undefined1 *local_68;
  QArrayDataPointer<QRect> QStack_60;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = *(QRegionPrivate **)(*(long *)r + 8);
  if ((pQVar7 != (QRegionPrivate *)0x0) && (pQVar7->numRects != 0)) {
    uVar1 = in_RDX->x1;
    uVar3 = in_RDX->y1;
    uVar2 = in_RDX->x2;
    uVar4 = in_RDX->y2;
    auVar8._0_4_ = -(uint)((int)uVar2 < (int)uVar1);
    auVar8._4_4_ = auVar8._0_4_;
    auVar8._8_4_ = -(uint)((int)uVar4 < (int)uVar3);
    auVar8._12_4_ = -(uint)((int)uVar4 < (int)uVar3);
    iVar6 = movmskpd((int)*(long *)r,auVar8);
    if ((iVar6 != 0) || (bVar5 = QRegionPrivate::contains(pQVar7,in_RDX), bVar5)) {
LAB_003d0cf9:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        QRegion(this,(QRegion *)r);
        return (QRegion)(QRegionData *)this;
      }
      goto LAB_003d0e93;
    }
    bVar5 = QRegionPrivate::within(*(QRegionPrivate **)(*(long *)r + 8),in_RDX);
    if (!bVar5) {
      pQVar7 = *(QRegionPrivate **)(*(long *)r + 8);
      if (pQVar7->numRects == 1) {
        bVar5 = ::comparesEqual(&pQVar7->extents,in_RDX);
        if (bVar5) goto LAB_003d0cf9;
        pQVar7 = *(QRegionPrivate **)(*(long *)r + 8);
      }
      bVar5 = QRegionPrivate::canAppend(pQVar7,in_RDX);
      if (bVar5) {
        this->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        QRegion(this,(QRegion *)r);
        detach(this);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          QRegionPrivate::append(this->d->qt_rgn,in_RDX);
          return (QRegion)(QRegionData *)this;
        }
      }
      else {
        bVar5 = QRegionPrivate::canPrepend(*(QRegionPrivate **)(*(long *)r + 8),in_RDX);
        this->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        if (bVar5) {
          QRegion(this,(QRegion *)r);
          detach(this);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
            QRegionPrivate::prepend(this->d->qt_rgn,in_RDX);
            return (QRegion)(QRegionData *)this;
          }
        }
        else {
          QRegion(this);
          detach(this);
          local_38 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
          local_48 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
          QStack_60.ptr = (QRect *)&DAT_aaaaaaaaaaaaaaaa;
          QStack_60.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          QStack_60.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          QRegionPrivate::QRegionPrivate((QRegionPrivate *)&local_68,in_RDX);
          UnionRegion(*(QRegionPrivate **)(*(long *)r + 8),(QRegionPrivate *)&local_68,
                      this->d->qt_rgn);
          QArrayDataPointer<QRect>::~QArrayDataPointer(&QStack_60);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
            return (QRegion)(QRegionData *)this;
          }
        }
      }
      goto LAB_003d0e93;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    QRegion(this,in_RDX,Rectangle);
    return (QRegion)(QRegionData *)this;
  }
LAB_003d0e93:
  __stack_chk_fail();
}

Assistant:

QRegion QRegion::united(const QRect &r) const
{
    if (isEmptyHelper(d->qt_rgn))
        return r;
    if (r.isEmpty())
        return *this;

    if (d->qt_rgn->contains(r)) {
        return *this;
    } else if (d->qt_rgn->within(r)) {
        return r;
    } else if (d->qt_rgn->numRects == 1 && d->qt_rgn->extents == r) {
        return *this;
    } else if (d->qt_rgn->canAppend(&r)) {
        QRegion result(*this);
        result.detach();
        result.d->qt_rgn->append(&r);
        return result;
    } else if (d->qt_rgn->canPrepend(&r)) {
        QRegion result(*this);
        result.detach();
        result.d->qt_rgn->prepend(&r);
        return result;
    } else {
        QRegion result;
        result.detach();
        QRegionPrivate rp(r);
        UnionRegion(d->qt_rgn, &rp, *result.d->qt_rgn);
        return result;
    }
}